

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O2

double __thiscall dlib::rand::get_random_gaussian(rand *this)

{
  bool bVar1;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  bVar1 = this->has_gaussian != true;
  if (bVar1) {
    get_random_complex_gaussian(this);
    this->next_gaussian = in_XMM1_Qa;
  }
  else {
    in_XMM0_Qa = this->next_gaussian;
  }
  this->has_gaussian = bVar1;
  return in_XMM0_Qa;
}

Assistant:

double get_random_gaussian (
            )
            {
                if (has_gaussian)
                {
                    has_gaussian = false;
                    return next_gaussian;
                }
                
                std::complex<double> r = get_random_complex_gaussian();
                next_gaussian = r.imag();
                has_gaussian = true;
                return r.real();
            }